

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_stream_test.c
# Opt level: O3

void test_tcp_listen_activation_wrong_family(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  nng_stream_listener *local_38;
  nng_stream_listener *l1;
  nng_stream_listener *pnStack_28;
  int fd;
  nng_stream_listener *l2;
  
  nuts_scratch_addr("ipc",0x40,test_tcp_listen_activation_wrong_family::nuts_addr_);
  nVar1 = nng_stream_listener_alloc(&local_38,"tcp://");
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,399,"%s: expected success, got %s (%d)",
                         "nng_stream_listener_alloc(&l1, \"tcp://\")",pcVar3,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_stream_listener_alloc
                      (&stack0xffffffffffffffd8,test_tcp_listen_activation_wrong_family::nuts_addr_)
    ;
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                           ,400,"%s: expected success, got %s (%d)",
                           "nng_stream_listener_alloc(&l2, addr)",pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_stream_listener_listen(pnStack_28);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                             ,0x191,"%s: expected success, got %s (%d)",
                             "nng_stream_listener_listen(l2)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_stream_listener_get_int(pnStack_28,"listen-fd",(int *)((long)&l1 + 4));
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                               ,0x192,"%s: expected success, got %s (%d)",
                               "nng_stream_listener_get_int(l2, NNG_OPT_LISTEN_FD, &fd)",pcVar3,
                               nVar1);
        if (iVar2 != 0) {
          num = nng_stream_listener_set_int(local_38,"listen-fd",l1._4_4_);
          pcVar3 = nng_strerror(NNG_EADDRINVAL);
          acutest_check_((uint)(num == NNG_EADDRINVAL),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x194,"%s fails with %s",
                         "nng_stream_listener_set_int(l1, NNG_OPT_LISTEN_FD, fd)",pcVar3,nVar1);
          pcVar3 = nng_strerror(NNG_EADDRINVAL);
          pcVar4 = nng_strerror(num);
          acutest_message_("%s: expected %s (%d), got %s (%d)",
                           "nng_stream_listener_set_int(l1, NNG_OPT_LISTEN_FD, fd)",pcVar3,0xf,
                           pcVar4,(ulong)num);
          nng_stream_listener_free(local_38);
          nng_stream_listener_free(pnStack_28);
          return;
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_tcp_listen_activation_wrong_family(void)
{

#if !defined(NNG_PLATFORM_POSIX) || !defined(NNG_TRANSPORT_IPC)
	NUTS_SKIP("Not posix or no IPC");
#else
	nng_stream_listener *l1;
	nng_stream_listener *l2;
	int                  fd;
	char                *addr;

	NUTS_ADDR(addr, "ipc");
	NUTS_PASS(nng_stream_listener_alloc(&l1, "tcp://"));
	NUTS_PASS(nng_stream_listener_alloc(&l2, addr));
	NUTS_PASS(nng_stream_listener_listen(l2));
	NUTS_PASS(nng_stream_listener_get_int(l2, NNG_OPT_LISTEN_FD, &fd));
	NUTS_FAIL(nng_stream_listener_set_int(l1, NNG_OPT_LISTEN_FD, fd),
	    NNG_EADDRINVAL);
	nng_stream_listener_free(l1);
	nng_stream_listener_free(l2);
#endif
}